

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  undefined8 *puVar24;
  void *pvVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ushort uVar76;
  short sVar77;
  short sVar78;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  int16_t *piVar79;
  long lVar80;
  ushort uVar81;
  ushort uVar82;
  short sVar83;
  ushort uVar91;
  short sVar92;
  ushort uVar94;
  short sVar95;
  ushort uVar97;
  short sVar98;
  ulong uVar84;
  ushort uVar90;
  ushort uVar93;
  ushort uVar99;
  short sVar100;
  ushort uVar102;
  ushort uVar104;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ushort uVar96;
  undefined1 auVar89 [16];
  short sVar103;
  short sVar105;
  ushort uVar106;
  short sVar107;
  ulong uVar101;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  __m128i vWH_00;
  __m128i vWH_01;
  __m128i vWH_02;
  __m128i vWH_03;
  int32_t j_00;
  int16_t *piVar111;
  int in_stack_ffffffffffffee80;
  int local_117c;
  int local_1168;
  int local_1164;
  int local_1150;
  int local_114c;
  int local_1138;
  int local_1134;
  int local_1120;
  int local_111c;
  int local_1108;
  int local_1104;
  int local_10f0;
  int local_10ec;
  int local_10d8;
  int local_10d4;
  int local_1090;
  int16_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWL;
  __m128i vNWS;
  __m128i vNWM;
  __m128i vNWH;
  __m128i vMat;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vs2;
  __m128i vs1;
  __m128i vJ;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF_opn;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE_opn;
  __m128i vE;
  __m128i vWL;
  __m128i vWS;
  __m128i vWM;
  __m128i vWH;
  __m128i vNL;
  __m128i vNS;
  __m128i vNM;
  __m128i vNH;
  __m128i case2;
  __m128i case1;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMaxL;
  __m128i vMaxS;
  __m128i vMaxM;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vNegInf0;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  ushort local_ca0;
  ushort local_c9e;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *FL_pr;
  int16_t *FS_pr;
  int16_t *FM_pr;
  int16_t *F_pr;
  int16_t *HL_pr;
  int16_t *HS_pr;
  int16_t *HM_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_FL_pr;
  int16_t *_FS_pr;
  int16_t *_FM_pr;
  int16_t *_F_pr;
  int16_t *_HL_pr;
  int16_t *_HS_pr;
  int16_t *_HM_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  ushort local_7b8;
  ushort uStack_7b6;
  ushort uStack_7b4;
  ushort uStack_7b2;
  ushort uStack_7b0;
  ushort uStack_7ae;
  ushort uStack_7ac;
  ushort uStack_7aa;
  short local_7a8;
  short sStack_7a6;
  short sStack_7a4;
  short sStack_7a2;
  short sStack_7a0;
  short sStack_79e;
  short sStack_79c;
  short sStack_79a;
  short local_798;
  short sStack_796;
  short sStack_794;
  short sStack_792;
  short sStack_790;
  short sStack_78e;
  short sStack_78c;
  short sStack_78a;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  short local_778;
  short sStack_776;
  short sStack_774;
  short sStack_772;
  short sStack_770;
  short sStack_76e;
  short sStack_76c;
  short sStack_76a;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_268;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  short sStack_25a;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint uStack_154;
  uint uStack_14c;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_16","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse41_128_16","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse41_128_16","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_diag_sse41_128_16","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_16","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_nw_stats_rowcol_diag_sse41_128_16");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_diag_sse41_128_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_diag_sse41_128_16","_s1Len"
               );
        return (parasail_result_t *)0x0;
      }
    }
    local_1090 = _s1Len;
    if (matrix->type != 0) {
      local_1090 = matrix->length;
    }
    _POS_LIMIT = local_1090 + -1;
    _matches = s2Len + -1;
    N._0_2_ = (short)open;
    sVar77 = (short)N;
    if (matrix->min <= -open) {
      sVar77 = -(short)matrix->min;
    }
    uVar76 = sVar77 + 0x8001;
    sVar77 = ((ushort)matrix->max ^ 0x7fff) - 1;
    vNegInf[1] = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    vSaturationCheckMax[0] = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    vSaturationCheckMax[1] = CONCAT26(sVar77,CONCAT24(sVar77,CONCAT22(sVar77,sVar77)));
    vSaturationCheckMin[0] = CONCAT26(sVar77,CONCAT24(sVar77,CONCAT22(sVar77,sVar77)));
    uVar26 = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    uVar29 = CONCAT26(uVar76,CONCAT24(uVar76,CONCAT22(uVar76,uVar76)));
    uVar27 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    uVar30 = CONCAT26((short)N,CONCAT24((short)N,CONCAT22((short)N,(short)N)));
    PAD._0_2_ = (short)gap;
    uVar28 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    uVar31 = CONCAT26((short)PAD,CONCAT24((short)PAD,CONCAT22((short)PAD,(short)PAD)));
    sVar78 = (short)PAD * 8;
    auVar32._2_2_ = sVar78;
    auVar32._0_2_ = sVar78;
    auVar32._4_2_ = sVar78;
    auVar32._6_2_ = sVar78;
    auVar32._10_2_ = sVar78;
    auVar32._8_2_ = sVar78;
    auVar32._12_2_ = sVar78;
    auVar32._14_2_ = sVar78;
    vI[0]._0_6_ = 0x100020003;
    vJreset[1] = 0x4000500060007;
    vI[0]._6_2_ = 0;
    vMaxH[0] = uVar29;
    vMaxM[1] = uVar26;
    vMaxM[0] = uVar29;
    vMaxS[1] = uVar26;
    vMaxS[0] = uVar29;
    vMaxL[1] = uVar26;
    vMaxL[0] = uVar29;
    vILimit[1] = uVar26;
    s2Len_PAD._0_2_ = (undefined2)local_1090;
    auVar108._2_2_ = (undefined2)s2Len_PAD;
    auVar108._0_2_ = (undefined2)s2Len_PAD;
    auVar108._4_2_ = (undefined2)s2Len_PAD;
    auVar108._6_2_ = (undefined2)s2Len_PAD;
    auVar108._10_2_ = (undefined2)s2Len_PAD;
    auVar108._8_2_ = (undefined2)s2Len_PAD;
    auVar108._12_2_ = (undefined2)s2Len_PAD;
    auVar108._14_2_ = (undefined2)s2Len_PAD;
    auVar85._8_8_ = 0x1000100010001;
    auVar85._0_8_ = 0x1000100010001;
    auVar85 = psubsw(auVar108,auVar85);
    gap_local._0_2_ = (undefined2)s2Len;
    auVar110._2_2_ = (undefined2)gap_local;
    auVar110._0_2_ = (undefined2)gap_local;
    auVar110._4_2_ = (undefined2)gap_local;
    auVar110._6_2_ = (undefined2)gap_local;
    auVar110._10_2_ = (undefined2)gap_local;
    auVar110._8_2_ = (undefined2)gap_local;
    auVar110._12_2_ = (undefined2)gap_local;
    auVar110._14_2_ = (undefined2)gap_local;
    auVar86._8_8_ = 0x1000100010001;
    auVar86._0_8_ = 0x1000100010001;
    auVar86 = psubsw(auVar110,auVar86);
    vIBoundary[0]._6_2_ = -(short)N;
    case1[1]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -6;
    case1[1]._0_2_ = ((short)PAD - (short)(gap << 3)) - (short)N;
    case1[1]._4_2_ = vIBoundary[0]._6_2_ + (short)PAD * -5;
    case1[1]._6_2_ = vIBoundary[0]._6_2_ - (short)(gap << 2);
    vIBoundary[0]._2_2_ = vIBoundary[0]._6_2_ + (short)PAD * -2;
    vIBoundary[0]._0_2_ = vIBoundary[0]._6_2_ + (short)PAD * -3;
    vIBoundary[0]._4_2_ = vIBoundary[0]._6_2_ - (short)PAD;
    _s1_local = (char *)parasail_result_new_rowcol3(local_1090,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x8211001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int16_t(0x10,(long)(local_1090 + 7));
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_02 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_03 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_04 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_05 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_06 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_07 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      ptr_08 = parasail_memalign_int16_t(0x10,(long)(s2Len + 0xe));
      piVar79 = ptr_00 + 7;
      if (ptr == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_02 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_03 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_04 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_05 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_06 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_07 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_08 == (int16_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        for (end_query = 0; end_query < local_1090; end_query = end_query + 1) {
          ptr[end_query] = (int16_t)matrix->mapper[(byte)_s1[end_query]];
        }
        for (end_query = local_1090; end_query < local_1090 + 7; end_query = end_query + 1) {
          ptr[end_query] = 0;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          piVar79[end_ref] = (int16_t)matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -7; iVar8 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          piVar79[end_ref] = 0;
        }
        while (end_ref = iVar8, end_ref < s2Len + 7) {
          piVar79[end_ref] = 0;
          iVar8 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 7] = -((short)end_ref * (short)PAD) - (short)N;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = uVar76;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
        }
        for (end_ref = -7; iVar8 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_01[(long)end_ref + 7] = 0;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = 0;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
        }
        while (end_ref = iVar8, end_ref < s2Len + 7) {
          ptr_01[(long)end_ref + 7] = 0;
          ptr_02[(long)end_ref + 7] = 0;
          ptr_03[(long)end_ref + 7] = 0;
          ptr_04[(long)end_ref + 7] = 0;
          ptr_05[(long)end_ref + 7] = 0;
          ptr_06[(long)end_ref + 7] = 0;
          ptr_07[(long)end_ref + 7] = 0;
          ptr_08[(long)end_ref + 7] = 0;
          iVar8 = end_ref + 1;
        }
        ptr_01[6] = 0;
        for (end_query = 0; end_query < local_1090; end_query = end_query + 8) {
          stack0xfffffffffffff198 = ZEXT816(0);
          stack0xfffffffffffff188 = ZEXT816(0);
          stack0xfffffffffffff178 = ZEXT816(0);
          stack0xfffffffffffff158 = ZEXT816(0);
          stack0xfffffffffffff148 = ZEXT816(0);
          stack0xfffffffffffff138 = ZEXT816(0);
          stack0xfffffffffffff128 = ZEXT216(uVar76) << 0x70;
          stack0xfffffffffffff0f8 = ZEXT816(0);
          stack0xfffffffffffff0e8 = ZEXT816(0);
          stack0xfffffffffffff0d8 = ZEXT816(0);
          stack0xfffffffffffff0c8 = ZEXT216(uVar76) << 0x70;
          stack0xfffffffffffff098 = ZEXT816(0);
          stack0xfffffffffffff088 = ZEXT816(0);
          stack0xfffffffffffff078 = ZEXT816(0);
          vJ[0]._0_6_ = 0xfffffffefffd;
          vs1[1] = 0xfffcfffbfffafff9;
          vJ[0]._6_2_ = 0;
          lVar80 = (long)end_query;
          sVar78 = ptr[lVar80];
          sVar1 = ptr[lVar80 + 1];
          sVar2 = ptr[lVar80 + 2];
          sVar3 = ptr[lVar80 + 3];
          sVar4 = ptr[lVar80 + 4];
          sVar5 = ptr[lVar80 + 5];
          sVar6 = ptr[lVar80 + 6];
          sVar7 = ptr[lVar80 + 7];
          vs2[0] = uVar29;
          matrow0 = (int *)uVar26;
          piVar16 = matrix->matrix;
          iVar8 = matrix->size;
          if (matrix->type == 0) {
            local_10d4 = (int)ptr[end_query];
          }
          else {
            if (end_query < local_1090) {
              local_10d8 = end_query;
            }
            else {
              local_10d8 = local_1090 + -1;
            }
            local_10d4 = local_10d8;
          }
          piVar17 = matrix->matrix;
          iVar9 = matrix->size;
          if (matrix->type == 0) {
            local_10ec = (int)ptr[end_query + 1];
          }
          else {
            if (end_query + 1 < local_1090) {
              local_10f0 = end_query + 1;
            }
            else {
              local_10f0 = local_1090 + -1;
            }
            local_10ec = local_10f0;
          }
          piVar18 = matrix->matrix;
          iVar10 = matrix->size;
          if (matrix->type == 0) {
            local_1104 = (int)ptr[end_query + 2];
          }
          else {
            if (end_query + 2 < local_1090) {
              local_1108 = end_query + 2;
            }
            else {
              local_1108 = local_1090 + -1;
            }
            local_1104 = local_1108;
          }
          piVar19 = matrix->matrix;
          iVar11 = matrix->size;
          if (matrix->type == 0) {
            local_111c = (int)ptr[end_query + 3];
          }
          else {
            if (end_query + 3 < local_1090) {
              local_1120 = end_query + 3;
            }
            else {
              local_1120 = local_1090 + -1;
            }
            local_111c = local_1120;
          }
          piVar20 = matrix->matrix;
          iVar12 = matrix->size;
          if (matrix->type == 0) {
            local_1134 = (int)ptr[end_query + 4];
          }
          else {
            if (end_query + 4 < local_1090) {
              local_1138 = end_query + 4;
            }
            else {
              local_1138 = local_1090 + -1;
            }
            local_1134 = local_1138;
          }
          piVar21 = matrix->matrix;
          iVar13 = matrix->size;
          if (matrix->type == 0) {
            local_114c = (int)ptr[end_query + 5];
          }
          else {
            if (end_query + 5 < local_1090) {
              local_1150 = end_query + 5;
            }
            else {
              local_1150 = local_1090 + -1;
            }
            local_114c = local_1150;
          }
          piVar22 = matrix->matrix;
          iVar14 = matrix->size;
          if (matrix->type == 0) {
            local_1164 = (int)ptr[end_query + 6];
          }
          else {
            if (end_query + 6 < local_1090) {
              local_1168 = end_query + 6;
            }
            else {
              local_1168 = local_1090 + -1;
            }
            local_1164 = local_1168;
          }
          piVar23 = matrix->matrix;
          iVar15 = matrix->size;
          if (matrix->type == 0) {
            local_117c = (int)ptr[end_query + 7];
          }
          else if (end_query + 7 < local_1090) {
            in_stack_ffffffffffffee80 = end_query + 7;
            local_117c = in_stack_ffffffffffffee80;
          }
          else {
            in_stack_ffffffffffffee80 = local_1090 + -1;
            local_117c = in_stack_ffffffffffffee80;
          }
          stack0xfffffffffffff1a8 = ZEXT216((ushort)ptr_01[6]) << 0x70;
          stack0xfffffffffffff168 =
               ZEXT216((ushort)-((short)N + (short)end_query * (short)PAD)) << 0x70;
          ptr_01[6] = -(((short)end_query + 8) * (short)PAD) - (short)N;
          for (end_ref = 0; auVar45 = stack0xfffffffffffff1a8, auVar44 = stack0xfffffffffffff198,
              auVar43 = stack0xfffffffffffff188, auVar42 = stack0xfffffffffffff178,
              auVar88 = stack0xfffffffffffff0c8, auVar109 = stack0xfffffffffffff098,
              auVar89 = stack0xfffffffffffff088, auVar108 = stack0xfffffffffffff078,
              auVar110 = _matrow0, end_ref < s2Len + 7; end_ref = end_ref + 1) {
            stack0xfffffffffffff1a8 = vWM._10_14_;
            vNH[0]._6_2_ = ptr_01[(long)end_ref + 7];
            auVar75 = stack0xfffffffffffff1a8;
            stack0xfffffffffffff198 = vWS._10_14_;
            vNM[0]._6_2_ = ptr_02[(long)end_ref + 7];
            auVar74 = stack0xfffffffffffff198;
            stack0xfffffffffffff188 = vWL._10_14_;
            vNS[0]._6_2_ = ptr_03[(long)end_ref + 7];
            auVar73 = stack0xfffffffffffff188;
            stack0xfffffffffffff178 = vE._10_14_;
            vNL[0]._6_2_ = ptr_04[(long)end_ref + 7];
            auVar65 = stack0xfffffffffffff178;
            stack0xfffffffffffff0c8 = vF_opn._10_14_;
            vF[0]._6_2_ = ptr_05[(long)end_ref + 7];
            auVar33 = stack0xfffffffffffff0c8;
            stack0xfffffffffffff098 = vFS._10_14_;
            vFM[0]._6_2_ = ptr_06[(long)end_ref + 7];
            auVar48 = stack0xfffffffffffff098;
            stack0xfffffffffffff088 = vFL._10_14_;
            vFS[0]._6_2_ = ptr_07[(long)end_ref + 7];
            auVar47 = stack0xfffffffffffff088;
            stack0xfffffffffffff078 = vJ._10_14_;
            vFL[0]._6_2_ = ptr_08[(long)end_ref + 7];
            auVar46 = stack0xfffffffffffff078;
            vNM[1] = vWM._10_8_;
            vNH[0] = auVar75._8_8_;
            auVar34._8_8_ = vNH[0];
            auVar34._0_8_ = vNM[1];
            auVar87._8_8_ = uVar30;
            auVar87._0_8_ = uVar27;
            auVar87 = psubsw(auVar34,auVar87);
            vF_opn[1] = auVar88._2_8_;
            vF[0] = auVar33._8_8_;
            auVar33._8_8_ = vF[0];
            auVar33._0_8_ = vF_opn[1];
            auVar88._8_8_ = uVar31;
            auVar88._0_8_ = uVar28;
            auVar88 = psubsw(auVar33,auVar88);
            local_778 = auVar87._0_2_;
            sStack_776 = auVar87._2_2_;
            sStack_774 = auVar87._4_2_;
            sStack_772 = auVar87._6_2_;
            sStack_770 = auVar87._8_2_;
            sStack_76e = auVar87._10_2_;
            sStack_76c = auVar87._12_2_;
            sStack_76a = auVar87._14_2_;
            local_788 = auVar88._0_2_;
            sStack_786 = auVar88._2_2_;
            sStack_784 = auVar88._4_2_;
            sStack_782 = auVar88._6_2_;
            sStack_780 = auVar88._8_2_;
            sStack_77e = auVar88._10_2_;
            sStack_77c = auVar88._12_2_;
            sStack_77a = auVar88._14_2_;
            uVar81 = (ushort)(local_778 < local_788) * local_788 |
                     (ushort)(local_778 >= local_788) * local_778;
            uVar90 = (ushort)(sStack_776 < sStack_786) * sStack_786 |
                     (ushort)(sStack_776 >= sStack_786) * sStack_776;
            uVar93 = (ushort)(sStack_774 < sStack_784) * sStack_784 |
                     (ushort)(sStack_774 >= sStack_784) * sStack_774;
            uVar96 = (ushort)(sStack_772 < sStack_782) * sStack_782 |
                     (ushort)(sStack_772 >= sStack_782) * sStack_772;
            vF[0]._0_2_ = (ushort)(sStack_770 < sStack_780) * sStack_780 |
                          (ushort)(sStack_770 >= sStack_780) * sStack_770;
            vF[0]._2_2_ = (ushort)(sStack_76e < sStack_77e) * sStack_77e |
                          (ushort)(sStack_76e >= sStack_77e) * sStack_76e;
            vF[0]._4_2_ = (ushort)(sStack_76c < sStack_77c) * sStack_77c |
                          (ushort)(sStack_76c >= sStack_77c) * sStack_76c;
            vF[0]._6_2_ = (ushort)(sStack_76a < sStack_77a) * sStack_77a |
                          (ushort)(sStack_76a >= sStack_77a) * sStack_76a;
            vF_opn[1] = CONCAT26(uVar96,CONCAT24(uVar93,CONCAT22(uVar90,uVar81)));
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_786 < sStack_776),-(ushort)(local_788 < local_778));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_784 < sStack_774),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_782 < sStack_772),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_77e < sStack_76e),-(ushort)(sStack_780 < sStack_770));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_77c < sStack_76c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_77a < sStack_76a),(undefined6)case1[0]);
            vFS[1] = auVar109._2_8_;
            vFM[0] = auVar48._8_8_;
            vNS[1] = vWS._10_8_;
            vNM[0] = auVar74._8_8_;
            auVar64._8_8_ = vFM[0];
            auVar64._0_8_ = vFS[1];
            auVar63._8_8_ = vNM[0];
            auVar63._0_8_ = vNS[1];
            auVar62._8_8_ = case1[0];
            auVar62._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar64,auVar63,auVar62);
            vFL[1] = auVar89._2_8_;
            vFS[0] = auVar47._8_8_;
            vNL[1] = vWL._10_8_;
            vNS[0] = auVar73._8_8_;
            auVar61._8_8_ = vFS[0];
            auVar61._0_8_ = vFL[1];
            auVar60._8_8_ = vNS[0];
            auVar60._0_8_ = vNL[1];
            auVar59._8_8_ = case1[0];
            auVar59._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar61,auVar60,auVar59);
            vJ[1] = auVar108._2_8_;
            vFL[0] = auVar46._8_8_;
            vWH[1] = vE._10_8_;
            vNL[0] = auVar65._8_8_;
            auVar58._8_8_ = vFL[0];
            auVar58._0_8_ = vJ[1];
            auVar57._8_8_ = vNL[0];
            auVar57._0_8_ = vWH[1];
            auVar56._8_8_ = case1[0];
            auVar56._0_8_ = case2[1];
            auVar108 = pblendvb(auVar58,auVar57,auVar56);
            auVar72._8_8_ = 0x1000100010001;
            auVar72._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(auVar108,auVar72);
            auVar109._8_8_ = uVar30;
            auVar109._0_8_ = uVar27;
            auVar108 = psubsw(stack0xfffffffffffff168,auVar109);
            auVar89._8_8_ = uVar31;
            auVar89._0_8_ = uVar28;
            auVar89 = psubsw(stack0xfffffffffffff128,auVar89);
            local_798 = auVar108._0_2_;
            sStack_796 = auVar108._2_2_;
            sStack_794 = auVar108._4_2_;
            sStack_792 = auVar108._6_2_;
            sStack_790 = auVar108._8_2_;
            sStack_78e = auVar108._10_2_;
            sStack_78c = auVar108._12_2_;
            sStack_78a = auVar108._14_2_;
            local_7a8 = auVar89._0_2_;
            sStack_7a6 = auVar89._2_2_;
            sStack_7a4 = auVar89._4_2_;
            sStack_7a2 = auVar89._6_2_;
            sStack_7a0 = auVar89._8_2_;
            sStack_79e = auVar89._10_2_;
            sStack_79c = auVar89._12_2_;
            sStack_79a = auVar89._14_2_;
            uVar82 = (ushort)(local_798 < local_7a8) * local_7a8 |
                     (ushort)(local_798 >= local_7a8) * local_798;
            uVar91 = (ushort)(sStack_796 < sStack_7a6) * sStack_7a6 |
                     (ushort)(sStack_796 >= sStack_7a6) * sStack_796;
            uVar94 = (ushort)(sStack_794 < sStack_7a4) * sStack_7a4 |
                     (ushort)(sStack_794 >= sStack_7a4) * sStack_794;
            uVar97 = (ushort)(sStack_792 < sStack_7a2) * sStack_7a2 |
                     (ushort)(sStack_792 >= sStack_7a2) * sStack_792;
            uVar99 = (ushort)(sStack_790 < sStack_7a0) * sStack_7a0 |
                     (ushort)(sStack_790 >= sStack_7a0) * sStack_790;
            uVar102 = (ushort)(sStack_78e < sStack_79e) * sStack_79e |
                      (ushort)(sStack_78e >= sStack_79e) * sStack_78e;
            uVar104 = (ushort)(sStack_78c < sStack_79c) * sStack_79c |
                      (ushort)(sStack_78c >= sStack_79c) * sStack_78c;
            uVar106 = (ushort)(sStack_78a < sStack_79a) * sStack_79a |
                      (ushort)(sStack_78a >= sStack_79a) * sStack_78a;
            vE_opn[1] = CONCAT26(uVar97,CONCAT24(uVar94,CONCAT22(uVar91,uVar82)));
            vE[0]._0_2_ = uVar99;
            vE[0]._2_2_ = uVar102;
            vE[0]._4_2_ = uVar104;
            vE[0]._6_2_ = uVar106;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_7a6 < sStack_796),-(ushort)(local_7a8 < local_798));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_7a4 < sStack_794),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_7a2 < sStack_792),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_79e < sStack_78e),-(ushort)(sStack_7a0 < sStack_790));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_79c < sStack_78c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_79a < sStack_78a),(undefined6)case1[0]);
            auVar55._8_8_ = case1[0];
            auVar55._0_8_ = case2[1];
            auVar109 = pblendvb(stack0xfffffffffffff0f8,stack0xfffffffffffff158,auVar55);
            auVar54._8_8_ = case1[0];
            auVar54._0_8_ = case2[1];
            auVar88 = pblendvb(stack0xfffffffffffff0e8,stack0xfffffffffffff148,auVar54);
            auVar53._8_8_ = case1[0];
            auVar53._0_8_ = case2[1];
            auVar108 = pblendvb(stack0xfffffffffffff0d8,stack0xfffffffffffff138,auVar53);
            auVar71._8_8_ = 0x1000100010001;
            auVar71._0_8_ = 0x1000100010001;
            auVar108 = paddsw(auVar108,auVar71);
            _matrow0 = matrow0._2_14_;
            vs2[0]._6_2_ = piVar79[end_ref];
            sVar83 = (short)piVar16[(long)(iVar8 * local_10d4) + (long)piVar79[end_ref]];
            sVar92 = (short)piVar17[(long)(iVar9 * local_10ec) + (long)piVar79[end_ref + -1]];
            sVar95 = (short)piVar18[(long)(iVar10 * local_1104) + (long)piVar79[end_ref + -2]];
            sVar98 = (short)piVar19[(long)(iVar11 * local_111c) + (long)piVar79[end_ref + -3]];
            sVar100 = (short)piVar20[(long)(iVar12 * local_1134) + (long)piVar79[end_ref + -4]];
            sVar103 = (short)piVar21[(long)(iVar13 * local_114c) + (long)piVar79[end_ref + -5]];
            sVar105 = (short)piVar22[(long)(iVar14 * local_1164) + (long)piVar79[end_ref + -6]];
            sVar107 = (short)piVar23[(long)(iVar15 * local_117c) + (long)piVar79[end_ref + -7]];
            auVar70._2_2_ = sVar105;
            auVar70._0_2_ = sVar107;
            auVar70._4_2_ = sVar103;
            auVar70._6_2_ = sVar100;
            auVar70._10_2_ = sVar95;
            auVar70._8_2_ = sVar98;
            auVar70._12_2_ = sVar92;
            auVar70._14_2_ = sVar83;
            auVar89 = paddsw(auVar45,auVar70);
            local_7b8 = auVar89._0_2_;
            uStack_7b6 = auVar89._2_2_;
            uStack_7b4 = auVar89._4_2_;
            uStack_7b2 = auVar89._6_2_;
            uStack_7b0 = auVar89._8_2_;
            uStack_7ae = auVar89._10_2_;
            uStack_7ac = auVar89._12_2_;
            uStack_7aa = auVar89._14_2_;
            uVar82 = ((short)local_7b8 < (short)uVar82) * uVar82 |
                     ((short)local_7b8 >= (short)uVar82) * local_7b8;
            uVar91 = ((short)uStack_7b6 < (short)uVar91) * uVar91 |
                     ((short)uStack_7b6 >= (short)uVar91) * uStack_7b6;
            uVar94 = ((short)uStack_7b4 < (short)uVar94) * uVar94 |
                     ((short)uStack_7b4 >= (short)uVar94) * uStack_7b4;
            uVar97 = ((short)uStack_7b2 < (short)uVar97) * uVar97 |
                     ((short)uStack_7b2 >= (short)uVar97) * uStack_7b2;
            uVar99 = ((short)uStack_7b0 < (short)uVar99) * uVar99 |
                     ((short)uStack_7b0 >= (short)uVar99) * uStack_7b0;
            uVar102 = ((short)uStack_7ae < (short)uVar102) * uVar102 |
                      ((short)uStack_7ae >= (short)uVar102) * uStack_7ae;
            uVar104 = ((short)uStack_7ac < (short)uVar104) * uVar104 |
                      ((short)uStack_7ac >= (short)uVar104) * uStack_7ac;
            uVar106 = ((short)uStack_7aa < (short)uVar106) * uVar106 |
                      ((short)uStack_7aa >= (short)uVar106) * uStack_7aa;
            uVar82 = ((short)uVar82 < (short)uVar81) * uVar81 |
                     ((short)uVar82 >= (short)uVar81) * uVar82;
            uVar91 = ((short)uVar91 < (short)uVar90) * uVar90 |
                     ((short)uVar91 >= (short)uVar90) * uVar91;
            uVar94 = ((short)uVar94 < (short)uVar93) * uVar93 |
                     ((short)uVar94 >= (short)uVar93) * uVar94;
            uVar97 = ((short)uVar97 < (short)uVar96) * uVar96 |
                     ((short)uVar97 >= (short)uVar96) * uVar97;
            uVar99 = ((short)uVar99 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     ((short)uVar99 >= (short)(ushort)vF[0]) * uVar99;
            uVar102 = ((short)uVar102 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                      ((short)uVar102 >= (short)vF[0]._2_2_) * uVar102;
            uVar104 = ((short)uVar104 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                      ((short)uVar104 >= (short)vF[0]._4_2_) * uVar104;
            uVar106 = ((short)uVar106 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                      ((short)uVar106 >= (short)vF[0]._6_2_) * uVar106;
            vWM[1] = CONCAT26(uVar97,CONCAT24(uVar94,CONCAT22(uVar91,uVar82)));
            vWH[0]._0_2_ = uVar99;
            vWH[0]._2_2_ = uVar102;
            vWH[0]._4_2_ = uVar104;
            vWH[0]._6_2_ = uVar106;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(uVar91 == uStack_7b6),-(ushort)(uVar82 == local_7b8));
            case2[1]._0_6_ = CONCAT24(-(ushort)(uVar94 == uStack_7b4),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(uVar97 == uStack_7b2),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(uVar102 == uStack_7ae),-(ushort)(uVar99 == uStack_7b0));
            case1[0]._0_6_ = CONCAT24(-(ushort)(uVar104 == uStack_7ac),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(uVar106 == uStack_7aa),(undefined6)case1[0]);
            vNH[1] = CONCAT26(-(ushort)(uVar97 == uVar96),
                              CONCAT24(-(ushort)(uVar94 == uVar93),
                                       CONCAT22(-(ushort)(uVar91 == uVar90),
                                                -(ushort)(uVar82 == uVar81))));
            case2[0] = CONCAT26(-(ushort)(uVar106 == vF[0]._6_2_),
                                CONCAT24(-(ushort)(uVar104 == vF[0]._4_2_),
                                         CONCAT22(-(ushort)(uVar102 == vF[0]._2_2_),
                                                  -(ushort)(uVar99 == (ushort)vF[0]))));
            vES[1] = auVar109._0_8_;
            vEM[0] = auVar109._8_8_;
            auVar52._8_8_ = case2[0];
            auVar52._0_8_ = vNH[1];
            auVar89 = pblendvb(auVar109,register0x00001240,auVar52);
            local_228 = auVar110._2_2_;
            sStack_226 = auVar110._4_2_;
            sStack_224 = auVar110._6_2_;
            sStack_222 = auVar110._8_2_;
            sStack_220 = auVar110._10_2_;
            sStack_21e = auVar110._12_2_;
            sStack_21c = auVar110._14_2_;
            auVar69._8_8_ =
                 CONCAT26(-(ushort)(sVar78 == piVar79[end_ref]),
                          CONCAT24(-(ushort)(sVar1 == sStack_21c),
                                   CONCAT22(-(ushort)(sVar2 == sStack_21e),
                                            -(ushort)(sVar3 == sStack_220)))) & 0x1000100010001;
            auVar69._0_8_ =
                 CONCAT26(-(ushort)(sVar4 == sStack_222),
                          CONCAT24(-(ushort)(sVar5 == sStack_224),
                                   CONCAT22(-(ushort)(sVar6 == sStack_226),
                                            -(ushort)(sVar7 == local_228)))) & 0x1000100010001;
            auVar110 = paddsw(auVar44,auVar69);
            auVar51._8_8_ = case1[0];
            auVar51._0_8_ = case2[1];
            auVar110 = pblendvb(auVar89,auVar110,auVar51);
            vEL[1] = auVar88._0_8_;
            vES[0] = auVar88._8_8_;
            auVar50._8_8_ = case2[0];
            auVar50._0_8_ = vNH[1];
            auVar109 = pblendvb(auVar88,register0x00001240,auVar50);
            auVar68._8_8_ =
                 CONCAT26(-(ushort)(0 < sVar83),
                          CONCAT24(-(ushort)(0 < sVar92),
                                   CONCAT22(-(ushort)(0 < sVar95),-(ushort)(0 < sVar98)))) &
                 0x1000100010001;
            auVar68._0_8_ =
                 CONCAT26(-(ushort)(0 < sVar100),
                          CONCAT24(-(ushort)(0 < sVar103),
                                   CONCAT22(-(ushort)(0 < sVar105),-(ushort)(0 < sVar107)))) &
                 0x1000100010001;
            auVar89 = paddsw(auVar43,auVar68);
            auVar49._8_8_ = case1[0];
            auVar49._0_8_ = case2[1];
            auVar89 = pblendvb(auVar109,auVar89,auVar49);
            auVar48._8_8_ = case2[0];
            auVar48._0_8_ = vNH[1];
            auVar88 = pblendvb(auVar108,register0x00001200,auVar48);
            auVar67._8_8_ = 0x1000100010001;
            auVar67._0_8_ = 0x1000100010001;
            auVar109 = paddsw(auVar42,auVar67);
            auVar47._8_8_ = case1[0];
            auVar47._0_8_ = case2[1];
            auVar109 = pblendvb(auVar88,auVar109,auVar47);
            local_238 = (short)vs1[1];
            sStack_236 = vs1[1]._2_2_;
            sStack_234 = vs1[1]._4_2_;
            sStack_232 = vs1[1]._6_2_;
            sStack_230 = (short)vs1[2];
            sStack_22e = vs1[2]._2_2_;
            sStack_22c = vs1[2]._4_2_;
            sStack_22a = vs1[2]._6_2_;
            sVar83 = -(ushort)(local_238 == -1);
            sVar92 = -(ushort)(sStack_236 == -1);
            sVar95 = -(ushort)(sStack_234 == -1);
            sVar98 = -(ushort)(sStack_232 == -1);
            sVar100 = -(ushort)(sStack_230 == -1);
            sVar103 = -(ushort)(sStack_22e == -1);
            sVar105 = -(ushort)(sStack_22c == -1);
            sVar107 = -(ushort)(sStack_22a == -1);
            auVar45._2_2_ = sVar92;
            auVar45._0_2_ = sVar83;
            auVar45._4_2_ = sVar95;
            auVar45._6_2_ = sVar98;
            auVar45._10_2_ = sVar103;
            auVar45._8_2_ = sVar100;
            auVar45._12_2_ = sVar105;
            auVar45._14_2_ = sVar107;
            auVar46._8_8_ = vWH[0];
            auVar46._0_8_ = vWM[1];
            register0x00001240 = pblendvb(auVar46,stack0xfffffffffffff1d8,auVar45);
            vWS[1] = auVar110._0_8_;
            vWM[0] = auVar110._8_8_;
            vWS[1] = ~CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) & vWS[1];
            vWM[0] = ~CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) & vWM[0];
            vWL[1] = auVar89._0_8_;
            vWS[0] = auVar89._8_8_;
            vWL[1] = ~CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) & vWL[1];
            vWS[0] = ~CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) & vWS[0];
            vE[1] = auVar109._0_8_;
            vWL[0] = auVar109._8_8_;
            vE[1] = ~CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) & vE[1];
            vWL[0] = ~CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) & vWL[0];
            auVar42._2_2_ = sVar92;
            auVar42._0_2_ = sVar83;
            auVar42._4_2_ = sVar95;
            auVar42._6_2_ = sVar98;
            auVar42._10_2_ = sVar103;
            auVar42._8_2_ = sVar100;
            auVar42._12_2_ = sVar105;
            auVar42._14_2_ = sVar107;
            auVar44._8_8_ = vE[0];
            auVar44._0_8_ = vE_opn[1];
            auVar43._8_8_ = uVar29;
            auVar43._0_8_ = uVar26;
            register0x00001280 = pblendvb(auVar44,auVar43,auVar42);
            vEM[0] = ~CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) & vEM[0];
            vES[1] = ~CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) & vES[1];
            vES[0] = ~CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) & vES[0];
            vEL[1] = ~CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) & vEL[1];
            uStack_154 = (uint)(CONCAT26(sVar98,CONCAT24(sVar95,CONCAT22(sVar92,sVar83))) >> 0x20);
            uStack_14c = (uint)(CONCAT26(sVar107,CONCAT24(sVar105,CONCAT22(sVar103,sVar100))) >>
                               0x20);
            local_168 = auVar108._0_4_;
            uStack_164 = auVar108._4_4_;
            uStack_160 = auVar108._8_4_;
            uStack_15c = auVar108._12_4_;
            vF[1] = CONCAT44((uStack_154 ^ 0xffffffff) & uStack_164,
                             (CONCAT22(sVar92,sVar83) ^ 0xffffffff) & local_168);
            vEL[0]._0_4_ = (CONCAT22(sVar103,sVar100) ^ 0xffffffff) & uStack_160;
            vEL[0]._4_4_ = (uStack_14c ^ 0xffffffff) & uStack_15c;
            local_828 = (short)vWS[1];
            local_848 = (short)vWL[1];
            local_868 = (short)vE[1];
            if (7 < end_ref) {
              local_98 = (short)vSaturationCheckMax[1];
              sStack_96 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_94 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_92 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_90 = (short)vSaturationCheckMin[0];
              sStack_8e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_8c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_8a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              sStack_a6 = vWM[1]._2_2_;
              sStack_a4 = vWM[1]._4_2_;
              sStack_a2 = vWM[1]._6_2_;
              sStack_a0 = (short)vWM[2];
              sStack_9e = vWM[2]._2_2_;
              sStack_9c = vWM[2]._4_2_;
              sStack_9a = vWM[2]._6_2_;
              vSaturationCheckMax[1] =
                   CONCAT26((ushort)(sStack_a2 < sStack_92) * sStack_a2 |
                            (ushort)(sStack_a2 >= sStack_92) * sStack_92,
                            CONCAT24((ushort)(sStack_a4 < sStack_94) * sStack_a4 |
                                     (ushort)(sStack_a4 >= sStack_94) * sStack_94,
                                     CONCAT22((ushort)(sStack_a6 < sStack_96) * sStack_a6 |
                                              (ushort)(sStack_a6 >= sStack_96) * sStack_96,
                                              (ushort)((short)vWM[1] < local_98) * (short)vWM[1] |
                                              (ushort)((short)vWM[1] >= local_98) * local_98)));
              vSaturationCheckMin[0] =
                   CONCAT26((ushort)(sStack_9a < sStack_8a) * sStack_9a |
                            (ushort)(sStack_9a >= sStack_8a) * sStack_8a,
                            CONCAT24((ushort)(sStack_9c < sStack_8c) * sStack_9c |
                                     (ushort)(sStack_9c >= sStack_8c) * sStack_8c,
                                     CONCAT22((ushort)(sStack_9e < sStack_8e) * sStack_9e |
                                              (ushort)(sStack_9e >= sStack_8e) * sStack_8e,
                                              (ushort)(sStack_a0 < sStack_90) * sStack_a0 |
                                              (ushort)(sStack_a0 >= sStack_90) * sStack_90)));
              local_7f8 = (short)vNegInf[1];
              sStack_7f6 = (short)((ulong)vNegInf[1] >> 0x10);
              sStack_7f4 = (short)((ulong)vNegInf[1] >> 0x20);
              sStack_7f2 = (short)((ulong)vNegInf[1] >> 0x30);
              sStack_7f0 = (short)vSaturationCheckMax[0];
              sStack_7ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_7ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_7ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              uVar82 = (ushort)(local_7f8 < (short)vWM[1]) * (short)vWM[1] |
                       (ushort)(local_7f8 >= (short)vWM[1]) * local_7f8;
              uVar90 = (ushort)(sStack_7f6 < sStack_a6) * sStack_a6 |
                       (ushort)(sStack_7f6 >= sStack_a6) * sStack_7f6;
              uVar91 = (ushort)(sStack_7f4 < sStack_a4) * sStack_a4 |
                       (ushort)(sStack_7f4 >= sStack_a4) * sStack_7f4;
              uVar93 = (ushort)(sStack_7f2 < sStack_a2) * sStack_a2 |
                       (ushort)(sStack_7f2 >= sStack_a2) * sStack_7f2;
              uVar94 = (ushort)(sStack_7f0 < sStack_a0) * sStack_a0 |
                       (ushort)(sStack_7f0 >= sStack_a0) * sStack_7f0;
              uVar96 = (ushort)(sStack_7ee < sStack_9e) * sStack_9e |
                       (ushort)(sStack_7ee >= sStack_9e) * sStack_7ee;
              uVar97 = (ushort)(sStack_7ec < sStack_9c) * sStack_9c |
                       (ushort)(sStack_7ec >= sStack_9c) * sStack_7ec;
              uVar99 = (ushort)(sStack_7ea < sStack_9a) * sStack_9a |
                       (ushort)(sStack_7ea >= sStack_9a) * sStack_7ea;
              sStack_826 = (short)((ulong)vWS[1] >> 0x10);
              sStack_824 = (short)((ulong)vWS[1] >> 0x20);
              sStack_822 = (short)((ulong)vWS[1] >> 0x30);
              sStack_820 = (short)vWM[0];
              sStack_81e = (short)((ulong)vWM[0] >> 0x10);
              sStack_81c = (short)((ulong)vWM[0] >> 0x20);
              sStack_81a = (short)((ulong)vWM[0] >> 0x30);
              uVar82 = (ushort)((short)uVar82 < local_828) * local_828 |
                       ((short)uVar82 >= local_828) * uVar82;
              uVar90 = (ushort)((short)uVar90 < sStack_826) * sStack_826 |
                       ((short)uVar90 >= sStack_826) * uVar90;
              uVar91 = (ushort)((short)uVar91 < sStack_824) * sStack_824 |
                       ((short)uVar91 >= sStack_824) * uVar91;
              uVar93 = (ushort)((short)uVar93 < sStack_822) * sStack_822 |
                       ((short)uVar93 >= sStack_822) * uVar93;
              uVar94 = (ushort)((short)uVar94 < sStack_820) * sStack_820 |
                       ((short)uVar94 >= sStack_820) * uVar94;
              uVar96 = (ushort)((short)uVar96 < sStack_81e) * sStack_81e |
                       ((short)uVar96 >= sStack_81e) * uVar96;
              uVar97 = (ushort)((short)uVar97 < sStack_81c) * sStack_81c |
                       ((short)uVar97 >= sStack_81c) * uVar97;
              uVar99 = (ushort)((short)uVar99 < sStack_81a) * sStack_81a |
                       ((short)uVar99 >= sStack_81a) * uVar99;
              sStack_846 = (short)((ulong)vWL[1] >> 0x10);
              sStack_844 = (short)((ulong)vWL[1] >> 0x20);
              sStack_842 = (short)((ulong)vWL[1] >> 0x30);
              sStack_840 = (short)vWS[0];
              sStack_83e = (short)((ulong)vWS[0] >> 0x10);
              sStack_83c = (short)((ulong)vWS[0] >> 0x20);
              sStack_83a = (short)((ulong)vWS[0] >> 0x30);
              uVar82 = (ushort)((short)uVar82 < local_848) * local_848 |
                       ((short)uVar82 >= local_848) * uVar82;
              uVar90 = (ushort)((short)uVar90 < sStack_846) * sStack_846 |
                       ((short)uVar90 >= sStack_846) * uVar90;
              uVar91 = (ushort)((short)uVar91 < sStack_844) * sStack_844 |
                       ((short)uVar91 >= sStack_844) * uVar91;
              uVar93 = (ushort)((short)uVar93 < sStack_842) * sStack_842 |
                       ((short)uVar93 >= sStack_842) * uVar93;
              uVar94 = (ushort)((short)uVar94 < sStack_840) * sStack_840 |
                       ((short)uVar94 >= sStack_840) * uVar94;
              uVar96 = (ushort)((short)uVar96 < sStack_83e) * sStack_83e |
                       ((short)uVar96 >= sStack_83e) * uVar96;
              uVar97 = (ushort)((short)uVar97 < sStack_83c) * sStack_83c |
                       ((short)uVar97 >= sStack_83c) * uVar97;
              uVar99 = (ushort)((short)uVar99 < sStack_83a) * sStack_83a |
                       ((short)uVar99 >= sStack_83a) * uVar99;
              sStack_866 = (short)((ulong)vE[1] >> 0x10);
              sStack_864 = (short)((ulong)vE[1] >> 0x20);
              sStack_862 = (short)((ulong)vE[1] >> 0x30);
              sStack_860 = (short)vWL[0];
              sStack_85e = (short)((ulong)vWL[0] >> 0x10);
              sStack_85c = (short)((ulong)vWL[0] >> 0x20);
              sStack_85a = (short)((ulong)vWL[0] >> 0x30);
              uVar82 = (ushort)((short)uVar82 < local_868) * local_868 |
                       ((short)uVar82 >= local_868) * uVar82;
              uVar90 = (ushort)((short)uVar90 < sStack_866) * sStack_866 |
                       ((short)uVar90 >= sStack_866) * uVar90;
              uVar91 = (ushort)((short)uVar91 < sStack_864) * sStack_864 |
                       ((short)uVar91 >= sStack_864) * uVar91;
              uVar93 = (ushort)((short)uVar93 < sStack_862) * sStack_862 |
                       ((short)uVar93 >= sStack_862) * uVar93;
              uVar94 = (ushort)((short)uVar94 < sStack_860) * sStack_860 |
                       ((short)uVar94 >= sStack_860) * uVar94;
              uVar96 = (ushort)((short)uVar96 < sStack_85e) * sStack_85e |
                       ((short)uVar96 >= sStack_85e) * uVar96;
              uVar97 = (ushort)((short)uVar97 < sStack_85c) * sStack_85c |
                       ((short)uVar97 >= sStack_85c) * uVar97;
              uVar99 = (ushort)((short)uVar99 < sStack_85a) * sStack_85a |
                       ((short)uVar99 >= sStack_85a) * uVar99;
              vNegInf[1] = CONCAT26((ushort)((short)uVar93 < sStack_862) * sStack_862 |
                                    ((short)uVar93 >= sStack_862) * uVar93,
                                    CONCAT24((ushort)((short)uVar91 < sStack_864) * sStack_864 |
                                             ((short)uVar91 >= sStack_864) * uVar91,
                                             CONCAT22((ushort)((short)uVar90 < sStack_866) *
                                                      sStack_866 |
                                                      ((short)uVar90 >= sStack_866) * uVar90,
                                                      (ushort)((short)uVar82 < local_868) *
                                                      local_868 |
                                                      ((short)uVar82 >= local_868) * uVar82)));
              vSaturationCheckMax[0] =
                   CONCAT26((ushort)((short)uVar99 < sStack_85a) * sStack_85a |
                            ((short)uVar99 >= sStack_85a) * uVar99,
                            CONCAT24((ushort)((short)uVar97 < sStack_85c) * sStack_85c |
                                     ((short)uVar97 >= sStack_85c) * uVar97,
                                     CONCAT22((ushort)((short)uVar96 < sStack_85e) * sStack_85e |
                                              ((short)uVar96 >= sStack_85e) * uVar96,
                                              (ushort)((short)uVar94 < sStack_860) * sStack_860 |
                                              ((short)uVar94 >= sStack_860) * uVar94)));
            }
            puVar24 = (undefined8 *)
                      ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_1090;
            vWH_00[1]._4_4_ = 0;
            piVar111 = piVar79;
            arr_store_rowcol((int *)*puVar24,(int *)puVar24[4],vWH_00,end_ref,s2Len,(int32_t)piVar79
                             ,in_stack_ffffffffffffee80);
            pvVar25 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_01[0] = (ulong)(uint)end_query;
            j_00 = (int32_t)piVar111;
            vWH_01[1]._0_4_ = local_1090;
            vWH_01[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar25 + 8),*(int **)((long)pvVar25 + 0x28),vWH_01,
                             end_ref,s2Len,j_00,in_stack_ffffffffffffee80);
            pvVar25 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_02[0] = (ulong)(uint)end_query;
            vWH_02[1]._0_4_ = local_1090;
            vWH_02[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar25 + 0x10),*(int **)((long)pvVar25 + 0x30),vWH_02,
                             end_ref,s2Len,j_00,in_stack_ffffffffffffee80);
            pvVar25 = ((((parasail_result_t *)_s1_local)->field_4).trace)->trace_del_table;
            vWH_03[0] = (ulong)(uint)end_query;
            vWH_03[1]._0_4_ = local_1090;
            vWH_03[1]._4_4_ = 0;
            arr_store_rowcol(*(int **)((long)pvVar25 + 0x18),*(int **)((long)pvVar25 + 0x38),vWH_03,
                             end_ref,s2Len,j_00,in_stack_ffffffffffffee80);
            ptr_01[(long)(end_ref + -7) + 7] = (short)vWM[1];
            ptr_02[(long)(end_ref + -7) + 7] = local_828;
            ptr_03[(long)(end_ref + -7) + 7] = local_848;
            ptr_04[(long)(end_ref + -7) + 7] = local_868;
            ptr_05[(long)(end_ref + -7) + 7] = uVar81;
            ptr_06[(long)(end_ref + -7) + 7] = (int16_t)vFS[1];
            ptr_07[(long)(end_ref + -7) + 7] = (int16_t)vFL[1];
            ptr_08[(long)(end_ref + -7) + 7] = (int16_t)vJ[1];
            local_258 = (short)vJreset[1];
            sStack_256 = vJreset[1]._2_2_;
            sStack_254 = vJreset[1]._4_2_;
            sStack_252 = vJreset[1]._6_2_;
            sStack_250 = (short)vJreset[2];
            sStack_24e = vJreset[2]._2_2_;
            sStack_24c = vJreset[2]._4_2_;
            sStack_24a = vJreset[2]._6_2_;
            local_268 = auVar85._0_2_;
            sStack_266 = auVar85._2_2_;
            sStack_264 = auVar85._4_2_;
            sStack_262 = auVar85._6_2_;
            sStack_260 = auVar85._8_2_;
            sStack_25e = auVar85._10_2_;
            sStack_25c = auVar85._12_2_;
            sStack_25a = auVar85._14_2_;
            local_288 = auVar86._0_2_;
            sStack_286 = auVar86._2_2_;
            sStack_284 = auVar86._4_2_;
            sStack_282 = auVar86._6_2_;
            sStack_280 = auVar86._8_2_;
            sStack_27e = auVar86._10_2_;
            sStack_27c = auVar86._12_2_;
            sStack_27a = auVar86._14_2_;
            uVar84 = CONCAT26(-(ushort)(sStack_252 == sStack_262),
                              CONCAT24(-(ushort)(sStack_254 == sStack_264),
                                       CONCAT22(-(ushort)(sStack_256 == sStack_266),
                                                -(ushort)(local_258 == local_268)))) &
                     CONCAT26(-(ushort)(sStack_232 == sStack_282),
                              CONCAT24(-(ushort)(sStack_234 == sStack_284),
                                       CONCAT22(-(ushort)(sStack_236 == sStack_286),
                                                -(ushort)(local_238 == local_288))));
            uVar101 = CONCAT26(-(ushort)(sStack_24a == sStack_25a),
                               CONCAT24(-(ushort)(sStack_24c == sStack_25c),
                                        CONCAT22(-(ushort)(sStack_24e == sStack_25e),
                                                 -(ushort)(sStack_250 == sStack_260)))) &
                      CONCAT26(-(ushort)(sStack_22a == sStack_27a),
                               CONCAT24(-(ushort)(sStack_22c == sStack_27c),
                                        CONCAT22(-(ushort)(sStack_22e == sStack_27e),
                                                 -(ushort)(sStack_230 == sStack_280))));
            auVar41._8_8_ = uVar101;
            auVar41._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xfffffffffffff258,register0x00001240,auVar41);
            auVar40._8_8_ = vWM[0];
            auVar40._0_8_ = vWS[1];
            auVar39._8_8_ = uVar101;
            auVar39._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xfffffffffffff248,auVar40,auVar39);
            auVar38._8_8_ = vWS[0];
            auVar38._0_8_ = vWL[1];
            auVar37._8_8_ = uVar101;
            auVar37._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xfffffffffffff238,auVar38,auVar37);
            auVar36._8_8_ = vWL[0];
            auVar36._0_8_ = vE[1];
            auVar35._8_8_ = uVar101;
            auVar35._0_8_ = uVar84;
            register0x00001240 = pblendvb(stack0xfffffffffffff228,auVar36,auVar35);
            auVar66._8_8_ = 0x1000100010001;
            auVar66._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(stack0xfffffffffffff068,auVar66);
            unique0x10005c90 = auVar65;
            unique0x10005cb0 = auVar73;
            unique0x10005cd0 = auVar74;
            unique0x10005cf0 = auVar75;
          }
          auVar65._8_8_ = 0x8000800080008;
          auVar65._0_8_ = 0x8000800080008;
          register0x00001200 = paddsw(stack0xfffffffffffff278,auVar65);
          register0x00001200 = psubsw(stack0xfffffffffffff1d8,auVar32);
        }
        vNegLimit[1]._4_2_ = uVar76;
        vNegLimit[1]._6_2_ = uVar76;
        local_ca0 = uVar76;
        local_c9e = uVar76;
        for (end_query = 0; end_query < 8; end_query = end_query + 1) {
          if ((short)local_c9e < (short)vMaxH[0]._6_2_) {
            local_c9e = vMaxH[0]._6_2_;
            local_ca0 = vMaxM[0]._6_2_;
            vNegLimit[1]._6_2_ = vMaxS[0]._6_2_;
            vNegLimit[1]._4_2_ = vMaxL[0]._6_2_;
          }
          vMaxH[0] = vMaxH[0] << 0x10 | (ulong)vMaxM[1] >> 0x30;
          vMaxM[1] = vMaxM[1] << 0x10;
          vMaxM[0] = vMaxM[0] << 0x10 | (ulong)vMaxS[1] >> 0x30;
          vMaxS[1] = vMaxS[1] << 0x10;
          vMaxS[0] = vMaxS[0] << 0x10 | (ulong)vMaxL[1] >> 0x30;
          vMaxL[1] = vMaxL[1] << 0x10;
          vMaxL[0] = vMaxL[0] << 0x10 | (ulong)vILimit[1] >> 0x30;
          vILimit[1] = vILimit[1] << 0x10;
        }
        local_38 = (short)vSaturationCheckMax[1];
        sStack_36 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_34 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_32 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_30 = (short)vSaturationCheckMin[0];
        sStack_2e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_2c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_2a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_758 = (short)vNegInf[1];
        sStack_756 = (short)((ulong)vNegInf[1] >> 0x10);
        sStack_754 = (short)((ulong)vNegInf[1] >> 0x20);
        sStack_752 = (short)((ulong)vNegInf[1] >> 0x30);
        sStack_750 = (short)vSaturationCheckMax[0];
        sStack_74e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_74c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_74a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar84 = CONCAT26(-(ushort)(sStack_2a < (short)uVar76),
                          CONCAT24(-(ushort)(sStack_2c < (short)uVar76),
                                   CONCAT22(-(ushort)(sStack_2e < (short)uVar76),
                                            -(ushort)(sStack_30 < (short)uVar76)))) |
                 CONCAT26(-(ushort)(sVar77 < sStack_74a),
                          CONCAT24(-(ushort)(sVar77 < sStack_74c),
                                   CONCAT22(-(ushort)(sVar77 < sStack_74e),
                                            -(ushort)(sVar77 < sStack_750))));
        auVar73._8_8_ = uVar84;
        auVar73._0_8_ =
             CONCAT26(-(ushort)(sStack_32 < (short)uVar76),
                      CONCAT24(-(ushort)(sStack_34 < (short)uVar76),
                               CONCAT22(-(ushort)(sStack_36 < (short)uVar76),
                                        -(ushort)(local_38 < (short)uVar76)))) |
             CONCAT26(-(ushort)(sVar77 < sStack_752),
                      CONCAT24(-(ushort)(sVar77 < sStack_754),
                               CONCAT22(-(ushort)(sVar77 < sStack_756),-(ushort)(sVar77 < local_758)
                                       )));
        if ((((((((((((((((auVar73 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar73 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar73 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar73 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar73 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar84 >> 7 & 1) != 0) || (uVar84 >> 0xf & 1) != 0) || (uVar84 >> 0x17 & 1) != 0)
               || (uVar84 >> 0x1f & 1) != 0) || (uVar84 >> 0x27 & 1) != 0) ||
             (uVar84 >> 0x2f & 1) != 0) || (uVar84 >> 0x37 & 1) != 0) || (long)uVar84 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_c9e = 0;
          local_ca0 = 0;
          vNegLimit[1]._6_2_ = 0;
          vNegLimit[1]._4_2_ = 0;
          _POS_LIMIT = 0;
          _matches = 0;
        }
        ((parasail_result_t *)_s1_local)->score = (int)(short)local_c9e;
        ((parasail_result_t *)_s1_local)->end_query = _POS_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = _matches;
        *(int *)(((parasail_result_t *)_s1_local)->field_4).extra = (int)(short)local_ca0;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->similar =
             (int)(short)vNegLimit[1]._6_2_;
        ((((parasail_result_t *)_s1_local)->field_4).stats)->length = (int)(short)vNegLimit[1]._4_2_
        ;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vNegInf0 = _mm_insert_epi16(vZero, NEG_LIMIT, 7);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
            matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
            similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
            length= (int16_t) _mm_extract_epi16(vMaxL, 7);
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
        vMaxM = _mm_slli_si128(vMaxM, 2);
        vMaxS = _mm_slli_si128(vMaxS, 2);
        vMaxL = _mm_slli_si128(vMaxL, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}